

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_fsync(LIBSSH2_SFTP_HANDLE *handle)

{
  int iVar1;
  uint32_t uVar2;
  ssize_t sVar3;
  uint32_t retcode;
  ssize_t rc;
  uchar *data;
  uchar *s;
  uchar *packet;
  size_t data_len;
  LIBSSH2_SESSION *pLStack_30;
  uint32_t packet_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP *sftp;
  LIBSSH2_SFTP_HANDLE *handle_local;
  
  channel = (LIBSSH2_CHANNEL *)handle->sftp;
  session = (LIBSSH2_SESSION *)(channel->node).next;
  pLStack_30 = (LIBSSH2_SESSION *)session->kex_prefs;
  data_len._4_4_ = (int)handle->handle_len + 0x22;
  packet = (uchar *)0x0;
  rc = 0;
  sftp = (LIBSSH2_SFTP *)handle;
  if (channel->reqPTY_state == libssh2_NB_state_idle) {
    *(uint32_t *)&(channel->local).close = 0;
    data = (uchar *)(*pLStack_30->alloc)((size_t)data_len._4_4_,(void **)pLStack_30);
    s = data;
    if (data == (uchar *)0x0) {
      iVar1 = _libssh2_error(pLStack_30,-6,"Unable to allocate memory for FXP_EXTENDED packet");
      return iVar1;
    }
    _libssh2_store_u32(&data,data_len._4_4_ - 4);
    *data = 200;
    iVar1 = *(int *)&(channel->node).prev;
    *(int *)&(channel->node).prev = iVar1 + 1;
    *(int *)(channel->reqPTY_packet + 0xc) = iVar1;
    data = data + 1;
    _libssh2_store_u32(&data,*(uint32_t *)(channel->reqPTY_packet + 0xc));
    _libssh2_store_str(&data,"fsync@openssh.com",0x11);
    _libssh2_store_str(&data,(char *)&(sftp->packets).first,(size_t)sftp->statvfs_packet);
    channel->reqPTY_state = libssh2_NB_state_created;
  }
  else {
    s = *(uchar **)(channel->reqPTY_packet + 4);
  }
  if (channel->reqPTY_state == libssh2_NB_state_created) {
    sVar3 = _libssh2_channel_write((LIBSSH2_CHANNEL *)session,0,s,(ulong)data_len._4_4_);
    if ((sVar3 == -0x25) || ((-1 < sVar3 && (sVar3 < (long)(ulong)data_len._4_4_)))) {
      *(uchar **)(channel->reqPTY_packet + 4) = s;
      return -0x25;
    }
    (*pLStack_30->free)(s,&pLStack_30->abstract);
    channel->reqPTY_packet[4] = '\0';
    channel->reqPTY_packet[5] = '\0';
    channel->reqPTY_packet[6] = '\0';
    channel->reqPTY_packet[7] = '\0';
    channel->reqPTY_packet[8] = '\0';
    channel->reqPTY_packet[9] = '\0';
    channel->reqPTY_packet[10] = '\0';
    channel->reqPTY_packet[0xb] = '\0';
    if (sVar3 < 0) {
      channel->reqPTY_state = libssh2_NB_state_idle;
      iVar1 = _libssh2_error(pLStack_30,-7,"_libssh2_channel_write() failed");
      return iVar1;
    }
    channel->reqPTY_state = libssh2_NB_state_sent;
  }
  iVar1 = sftp_packet_require((LIBSSH2_SFTP *)channel,'e',
                              *(uint32_t *)(channel->reqPTY_packet + 0xc),(uchar **)&rc,
                              (size_t *)&packet,9);
  if (iVar1 == -0x25) {
    handle_local._4_4_ = -0x25;
  }
  else if (iVar1 == -0x26) {
    if (packet != (uchar *)0x0) {
      (*pLStack_30->free)((void *)rc,&pLStack_30->abstract);
    }
    handle_local._4_4_ = _libssh2_error(pLStack_30,-0x1f,"SFTP fsync packet too short");
  }
  else if (iVar1 == 0) {
    channel->reqPTY_state = libssh2_NB_state_idle;
    uVar2 = _libssh2_ntohu32((uchar *)(rc + 5));
    (*pLStack_30->free)((void *)rc,&pLStack_30->abstract);
    if (uVar2 == 0) {
      handle_local._4_4_ = 0;
    }
    else {
      (channel->local).close = (char)uVar2;
      (channel->local).eof = (char)(uVar2 >> 8);
      (channel->local).extended_data_ignore_mode = (char)(uVar2 >> 0x10);
      (channel->local).field_0x13 = (char)(uVar2 >> 0x18);
      handle_local._4_4_ = _libssh2_error(pLStack_30,-0x1f,"fsync failed");
    }
  }
  else {
    channel->reqPTY_state = libssh2_NB_state_idle;
    handle_local._4_4_ = _libssh2_error(pLStack_30,iVar1,"Error waiting for FXP EXTENDED REPLY");
  }
  return handle_local._4_4_;
}

Assistant:

static int sftp_fsync(LIBSSH2_SFTP_HANDLE *handle)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    /* 34 = packet_len(4) + packet_type(1) + request_id(4) +
       string_len(4) + strlen("fsync@openssh.com")(17) + handle_len(4) */
    uint32_t packet_len = (uint32_t)(handle->handle_len + 34);
    size_t data_len = 0;
    unsigned char *packet, *s, *data = NULL;
    ssize_t rc;
    uint32_t retcode;

    if(sftp->fsync_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Issuing fsync command"));
        s = packet = LIBSSH2_ALLOC(session, packet_len);
        if(!packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for FXP_EXTENDED "
                                  "packet");
        }

        _libssh2_store_u32(&s, packet_len - 4);
        *(s++) = SSH_FXP_EXTENDED;
        sftp->fsync_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->fsync_request_id);
        _libssh2_store_str(&s, "fsync@openssh.com", 17);
        _libssh2_store_str(&s, handle->handle, handle->handle_len);

        sftp->fsync_state = libssh2_NB_state_created;
    }
    else {
        packet = sftp->fsync_packet;
    }

    if(sftp->fsync_state == libssh2_NB_state_created) {
        rc = _libssh2_channel_write(channel, 0, packet, packet_len);
        if(rc == LIBSSH2_ERROR_EAGAIN ||
            (0 <= rc && rc < (ssize_t)packet_len)) {
            sftp->fsync_packet = packet;
            return LIBSSH2_ERROR_EAGAIN;
        }

        LIBSSH2_FREE(session, packet);
        sftp->fsync_packet = NULL;

        if(rc < 0) {
            sftp->fsync_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "_libssh2_channel_write() failed");
        }
        sftp->fsync_state = libssh2_NB_state_sent;
    }

    rc = sftp_packet_require(sftp, SSH_FXP_STATUS,
                             sftp->fsync_request_id, &data, &data_len, 9);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return (int)rc;
    }
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP fsync packet too short");
    }
    else if(rc) {
        sftp->fsync_state = libssh2_NB_state_idle;
        return _libssh2_error(session, (int)rc,
                              "Error waiting for FXP EXTENDED REPLY");
    }

    sftp->fsync_state = libssh2_NB_state_idle;

    retcode = _libssh2_ntohu32(data + 5);
    LIBSSH2_FREE(session, data);

    if(retcode != LIBSSH2_FX_OK) {
        sftp->last_errno = retcode;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "fsync failed");
    }

    return 0;
}